

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilUtil.c
# Opt level: O0

char * Extra_UtilFileSearch(char *file,char *path,char *mode)

{
  bool bVar1;
  int iVar2;
  char *__ptr;
  char *pcVar3;
  size_t sVar4;
  size_t sVar5;
  char *filename_00;
  char *cp;
  char *save_path;
  char *filename;
  char *buffer;
  int quit;
  char *mode_local;
  char *path_local;
  char *file_local;
  
  if ((path == (char *)0x0) || (iVar2 = strcmp(path,""), mode_local = path, iVar2 == 0)) {
    mode_local = ".";
  }
  __ptr = Extra_UtilStrsav(mode_local);
  bVar1 = false;
  mode_local = __ptr;
  while( true ) {
    pcVar3 = strchr(mode_local,0x3a);
    if (pcVar3 == (char *)0x0) {
      bVar1 = true;
    }
    else {
      *pcVar3 = '\0';
    }
    iVar2 = strcmp(mode_local,".");
    if (iVar2 == 0) {
      filename = Extra_UtilStrsav(file);
    }
    else {
      sVar4 = strlen(mode_local);
      sVar5 = strlen(file);
      filename = (char *)malloc(sVar4 + sVar5 + 4);
      sprintf(filename,"%s/%s",mode_local,file);
    }
    filename_00 = Extra_UtilTildeExpand(filename);
    if (filename != (char *)0x0) {
      free(filename);
    }
    iVar2 = Extra_UtilCheckFile(filename_00,mode);
    if (iVar2 != 0) break;
    if (filename_00 != (char *)0x0) {
      free(filename_00);
    }
    mode_local = pcVar3 + 1;
    if (bVar1) {
      if (__ptr != (char *)0x0) {
        free(__ptr);
      }
      return (char *)0x0;
    }
  }
  if (__ptr == (char *)0x0) {
    return filename_00;
  }
  free(__ptr);
  return filename_00;
}

Assistant:

char * Extra_UtilFileSearch(char *file, char *path, char *mode)
//char *file;			// file we're looking for 
//char *path;			// search path, colon separated 
//char *mode;			// "r", "w", or "x" 
{
    int quit;
    char *buffer, *filename, *save_path, *cp;

    if (path == 0 || strcmp(path, "") == 0) {
	path = ".";		/* just look in the current directory */
    }

    save_path = path = Extra_UtilStrsav(path);
    quit = 0;
    do {
	cp = strchr(path, ':');
	if (cp != 0) {
	    *cp = '\0';
	} else {
	    quit = 1;
	}

	/* cons up the filename out of the path and file name */
	if (strcmp(path, ".") == 0) {
	    buffer = Extra_UtilStrsav(file);
	} else {
	    buffer = ABC_ALLOC(char, strlen(path) + strlen(file) + 4);
	    (void) sprintf(buffer, "%s/%s", path, file);
	}
	filename = Extra_UtilTildeExpand(buffer);
	ABC_FREE(buffer);

	/* see if we can access it */
	if (Extra_UtilCheckFile(filename, mode)) {
	    ABC_FREE(save_path);
	    return filename;
	}
	ABC_FREE(filename);
	path = ++cp;
    } while (! quit); 

    ABC_FREE(save_path);
    return 0;
}